

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::filterPoints(Earcut<unsigned_int> *this,Node *start,Node *end)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Node *pNVar4;
  Node *pNVar5;
  bool bVar6;
  double dVar7;
  
  if (end == (Node *)0x0) {
    end = start;
  }
  do {
    pNVar4 = start->next;
    if (start->steiner == false) {
      dVar7 = start->x;
      dVar1 = start->y;
      dVar2 = pNVar4->x;
      dVar3 = pNVar4->y;
      pNVar5 = start->prev;
      if ((dVar7 != dVar2) || (NAN(dVar7) || NAN(dVar2))) {
LAB_003a259f:
        dVar7 = (dVar2 - dVar7) * (dVar1 - pNVar5->y) - (dVar7 - pNVar5->x) * (dVar3 - dVar1);
        if ((dVar7 != 0.0) || (NAN(dVar7))) goto LAB_003a2570;
      }
      else if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) goto LAB_003a259f;
      pNVar4->prev = pNVar5;
      pNVar5->next = pNVar4;
      pNVar4 = start->prevZ;
      pNVar5 = start->nextZ;
      if (pNVar4 != (Node *)0x0) {
        pNVar4->nextZ = pNVar5;
      }
      if (pNVar5 != (Node *)0x0) {
        pNVar5->prevZ = pNVar4;
      }
      end = start->prev;
      bVar6 = true;
      start = end;
      if (end == end->next) {
        return end;
      }
    }
    else {
LAB_003a2570:
      bVar6 = false;
      start = pNVar4;
    }
    if ((!bVar6) && (start == end)) {
      return end;
    }
  } while( true );
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::filterPoints(Node* start, Node* end) {
    if (!end) end = start;

    Node* p = start;
    bool again;
    do {
        again = false;

        if (!p->steiner && (equals(p, p->next) || area(p->prev, p, p->next) == 0)) {
            removeNode(p);
            p = end = p->prev;

            if (p == p->next) break;
            again = true;

        } else {
            p = p->next;
        }
    } while (again || p != end);

    return end;
}